

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadSafeRingBuffer.hpp
# Opt level: O2

void __thiscall
de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
          (ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*> *this,Task **elem)

{
  size_t sVar1;
  
  Mutex::lock(&this->m_writeMutex);
  Semaphore::decrement(&this->m_empty);
  sVar1 = this->m_front;
  (this->m_elements).
  super__Vector_base<vkt::(anonymous_namespace)::Task_*,_std::allocator<vkt::(anonymous_namespace)::Task_*>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar1] = *elem;
  this->m_front = (sVar1 + 1) % this->m_size;
  Semaphore::increment(&this->m_fill);
  Mutex::unlock(&this->m_writeMutex);
  return;
}

Assistant:

void ThreadSafeRingBuffer<T>::pushFront (const T& elem)
{
	m_writeMutex.lock();
	m_empty.decrement();
	pushFrontInternal(elem);
	m_fill.increment();
	m_writeMutex.unlock();
}